

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

void INT_EVdfg_enable_auto_stone(EVdfg_stone stone,int period_sec,int period_usec)

{
  EVdfg_config_action act_00;
  EVdfg_config_action act;
  
  act_00.stone_id = stone->stone_id;
  act_00.type = 3;
  act_00.u.period.usecs = period_usec;
  act_00.u.period.secs = period_sec;
  act_00._8_8_ = act._8_8_;
  act_00.u._8_8_ = act.u._8_8_;
  EVdfg_perform_act_on_state(stone->dfg->working_state,act_00,1);
  return;
}

Assistant:

extern void 
INT_EVdfg_enable_auto_stone(EVdfg_stone stone, int period_sec, 
			int period_usec)
{
    EVdfg_config_action act;
    act.type = ACT_set_auto_period;
    act.stone_id = stone->stone_id;
    act.u.period.secs = period_sec;
    act.u.period.usecs = period_usec;
    (void)EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
}